

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

HRESULT __thiscall
Js::ByteCodeBufferBuilder::RewriteAsmJsByteCodesInto
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,
          FunctionBody *function,ByteBlock *byteBlock,SerializedFieldList *definedFields)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  code *pcVar2;
  FunctionBody *pFVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  OpCodeAsmJs op;
  OpLayoutTypeAsmJs OVar7;
  uint uVar8;
  BufferBuilder *pBVar9;
  ImmutableList<Js::BufferBuilder_*> *pIVar10;
  undefined4 *puVar11;
  HRESULT HVar12;
  undefined1 local_e0 [8];
  anon_class_56_7_a35c0bdf saveBlock;
  SListCounted<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator> auxRecords;
  LPCWSTR clue_local;
  byte *opStart;
  BufferBuilderList *local_78;
  ByteCodeBufferBuilder *local_70;
  FunctionBody *local_68;
  ByteBlock *local_60;
  undefined1 local_58 [8];
  uint32 size;
  bool cantGenerate;
  ByteCodeReader reader;
  LayoutSize layoutSize;
  
  auxRecords.super_SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>._8_8_ =
       this->alloc;
  saveBlock.cantGenerate = (bool *)&saveBlock.cantGenerate;
  auxRecords.super_SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next._0_4_ = 0;
  auxRecords.super_SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>.
  allocator = (Type)clue;
  opStart = (byte *)definedFields;
  local_68 = function;
  local_60 = byteBlock;
  pBVar9 = (BufferBuilder *)
           new<Memory::ArenaAllocator>
                     (0x18,(ArenaAllocator *)
                           auxRecords.
                           super_SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>
                           .
                           super_SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>
                           ._8_8_,0x364470);
  pBVar9->clue = L"Final Byte Code Size";
  *(undefined8 *)&pBVar9->offset = 0xffffffff;
  pBVar9->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd708;
  pIVar1 = builder->list;
  local_70 = this;
  pIVar10 = (ImmutableList<Js::BufferBuilder_*> *)
            new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pFVar3 = local_68;
  pIVar10->value = pBVar9;
  pIVar10->next = pIVar1;
  builder->list = pIVar10;
  ByteCodeReader::Create((ByteCodeReader *)&size,local_68,0);
  saveBlock.builder = (BufferBuilderList *)local_58;
  local_58._0_4_ = 0;
  saveBlock.reader = (ByteCodeReader *)&clue_local;
  clue_local = (LPCWSTR)0x0;
  saveBlock.size = (uint32 *)(local_58 + 7);
  local_58[7] = 0;
  saveBlock.opStart = (byte **)local_70;
  saveBlock.this =
       (ByteCodeBufferBuilder *)
       &auxRecords.
        super_SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>.
        allocator;
  local_e0 = (undefined1  [8])&size;
  saveBlock.clue = (LPCWSTR *)builder;
  local_78 = builder;
  if (pFVar3->hasCachedScopePropIds == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x394,"(!function->HasCachedScopePropIds())",
                                "!function->HasCachedScopePropIds()");
    if (!bVar6) goto LAB_0087da37;
    *puVar11 = 0;
    if ((local_58[7] & 1) == 0) goto LAB_0087658d;
  }
  else {
LAB_0087658d:
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      clue_local = (LPCWSTR)ByteCodeReader::GetIP((ByteCodeReader *)&size);
      op = ByteCodeReader::ReadAsmJsOp
                     ((ByteCodeReader *)&size,(LayoutSize *)((long)&reader.m_endLocation + 4));
      if (op == EndOfBlock) {
        RewriteAsmJsByteCodesInto::anon_class_56_7_a35c0bdf::operator()
                  ((anon_class_56_7_a35c0bdf *)local_e0);
        break;
      }
      OVar7 = OpCodeUtilAsmJs::GetOpCodeLayout(op);
      switch(OVar7._value) {
      case 0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::ElementSlot_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::ElementSlot_Medium((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 0) {
          ByteCodeReader::ElementSlot_Small((ByteCodeReader *)&size);
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                      ,0x81,"((0))","(0)");
LAB_0087d92a:
          if (bVar6 == false) goto LAB_0087da37;
LAB_0087d932:
          *puVar11 = 0;
        }
        break;
      case 1:
        if (reader.m_endLocation._4_4_ != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                      ,0x82,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar6) goto LAB_0087da37;
          *puVar11 = 0;
        }
        ByteCodeReader::StartCall((ByteCodeReader *)&size);
        break;
      case 2:
        if (reader.m_endLocation._4_4_ != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                      ,0x83,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar6) goto LAB_0087da37;
          *puVar11 = 0;
        }
        ByteCodeReader::Empty((ByteCodeReader *)&size);
        break;
      case 3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmTypedArr_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmTypedArr_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x85,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmTypedArr_Small((ByteCodeReader *)&size);
        }
        break;
      case 4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::WasmMemAccess_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::WasmMemAccess_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x86,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::WasmMemAccess_Small((ByteCodeReader *)&size);
        }
        break;
      case 5:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmCall_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmCall_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x87,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmCall_Small((ByteCodeReader *)&size);
        }
        break;
      case 6:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::ProfiledAsmCall_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::ProfiledAsmCall_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x87,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::ProfiledAsmCall_Small((ByteCodeReader *)&size);
        }
        break;
      case 7:
        if (reader.m_endLocation._4_4_ != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                      ,0x88,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar6) goto LAB_0087da37;
          *puVar11 = 0;
        }
        ByteCodeReader::AsmBr((ByteCodeReader *)&size);
        break;
      case 8:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x89,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg1_Small((ByteCodeReader *)&size);
        }
        break;
      case 9:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8a,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg2_Small((ByteCodeReader *)&size);
        }
        break;
      case 10:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8b,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8c,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg5_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg5_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8d,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg5_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg6_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg6_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8e,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg6_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg7_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg7_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x8f,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg7_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xf:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg9_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg9_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x90,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg9_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x10:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg10_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg10_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x91,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg10_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x11:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg11_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg11_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x92,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg11_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x12:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg17_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg17_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x93,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg17_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x13:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg18_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg18_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x94,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg18_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x14:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmReg19_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmReg19_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x95,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmReg19_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x15:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x96,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x16:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x97,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x17:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Const1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Const1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x98,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double1Const1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x18:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x99,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x19:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9a,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Reg1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Reg1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9b,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double1Reg1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Reg1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Reg1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9c,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float1Reg1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Reg1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Reg1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9d,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Reg1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9e,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x9f,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x1f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa0,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x20:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Const1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Const1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa1,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Const1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x21:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1IntConst1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1IntConst1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa2,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1IntConst1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x22:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Double2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Double2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa3,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Double2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x23:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Float2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Float2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa4,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Float2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x24:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa5,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x25:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa6,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x26:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa7,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x27:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa8,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x28:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xa9,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x29:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Const1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Const1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xaa,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float1Const1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xab,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xac,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xad,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::BrInt1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::BrInt1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xae,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::BrInt1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::BrInt2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::BrInt2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xaf,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::BrInt2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x2f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::BrInt1Const1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::BrInt1Const1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb0,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::BrInt1Const1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x30:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmUnsigned1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmUnsigned1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb1,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::AsmUnsigned1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x31:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::WasmLoopStart_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::WasmLoopStart_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb2,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::WasmLoopStart_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x32:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Reg1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Reg1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb5,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long1Reg1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x33:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb6,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x34:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Const1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Const1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb7,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long1Const1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x35:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb8,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x36:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xb9,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x37:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Long2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Long2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xba,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Long2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x38:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xbb,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x39:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xbc,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Int1Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xbd,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xbe,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float1Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xbf,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Long1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc0,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Double1Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc3,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x3f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc4,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x40:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc5,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x41:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_1Float32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_1Float32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc6,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Bool32x4_1Float32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x42:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,199,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x43:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Float4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Float4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,200,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Float4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x44:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_2Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_2Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xc9,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_2Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x45:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_3Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_3Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xca,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_3Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x46:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xcb,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x47:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_2Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_2Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xcc,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_2Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x48:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xce,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x49:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xcf,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd0,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd1,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd2,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd3,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Float32x4_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd4,"((0))","(0)");
            goto LAB_0087d92a;
          }
          ByteCodeReader::Reg1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x4f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float1Float32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float1Float32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd5,"((0))","(0)");
joined_r0x0087cd71:
            if (bVar6 != false) goto LAB_0087d932;
            goto LAB_0087da37;
          }
          ByteCodeReader::Float1Float32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x50:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_2Int1Float1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_2Int1Float1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd6,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float32x4_2Int1Float1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x51:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd8,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x52:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xd9,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x53:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xda,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x54:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_1Int32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_1Int32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xdb,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_1Int32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x55:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xdc,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x56:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xdd,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x57:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_2Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_2Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xde,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_2Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x58:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_3Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_3Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xdf,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_3Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x59:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe0,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe1,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe2,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe3,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe5,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe6,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x5f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe7,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x60:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe8,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x61:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xe9,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x62:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Int32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Int32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xea,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Int32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 99:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int32x4_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int32x4_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xeb,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int32x4_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 100:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float32x4_IntConst4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float32x4_IntConst4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xec,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float32x4_IntConst4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x65:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Double1Float64x2_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Double1Float64x2_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xef,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Double1Float64x2_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x66:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float64x2_2Int1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float64x2_2Int1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xf0,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float64x2_2Int1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x67:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float64x2_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float64x2_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xf1,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float64x2_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x68:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float64x2_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float64x2_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xf2,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float64x2_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x69:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Float64x2_1Double1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Float64x2_1Double1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0xf3,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Float64x2_1Double1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int64x2_1Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int64x2_1Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x102,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int64x2_1Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Long1Int64x2_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Long1Int64x2_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x103,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Long1Int64x2_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int64x2_2_Int1_Long1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int64x2_2_Int1_Long1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x104,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int64x2_2_Int1_Long1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int64x2_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int64x2_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x105,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int64x2_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int64x2_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int64x2_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x106,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int64x2_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x6f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int64x2_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int64x2_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x107,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int64x2_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x70:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool64x2_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool64x2_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x108,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool64x2_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x71:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x10b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x72:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x10c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x73:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x10d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x74:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Int16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Int16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x10e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Int16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x75:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_2Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_2Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x10f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_2Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x76:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_3Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_3Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x110,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_3Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x77:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x111,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x78:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x112,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x79:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x113,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_1Int16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_1Int16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x114,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_1Int16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x115,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x116,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x117,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x118,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x7f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x119,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x80:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x11a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x81:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x11b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x82:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int16x8_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int16x8_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x11c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int16x8_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x83:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x11e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x84:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x11f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x85:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x120,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x86:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_2Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_2Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x121,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_2Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x87:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_3Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_3Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x122,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_3Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x88:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x123,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x89:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x124,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x125,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_1Int8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_1Int8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x126,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_1Int8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x127,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x128,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x129,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x8f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x12a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x90:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,299,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x91:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,300,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x92:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x12d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x93:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Int8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Int8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x12e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Int8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x94:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int8x16_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int8x16_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x12f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int8x16_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x95:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x131,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x96:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x132,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x97:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x133,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x98:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Uint32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Uint32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x134,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Uint32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x99:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_2Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_2Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x135,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_2Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9a:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_3Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_3Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x136,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_3Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9b:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x137,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9c:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x138,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9d:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x139,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9e:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_1Uint32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_1Uint32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_1Uint32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0x9f:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa1:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa2:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x13f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x140,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa5:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x141,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa6:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint32x4_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint32x4_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x142,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint32x4_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa7:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x145,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa8:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x146,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xa9:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x147,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xaa:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Uint16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Uint16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x148,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Uint16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xab:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_2Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_2Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x149,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_2Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xac:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_3Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_3Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_3Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xad:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xae:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xaf:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_1Uint16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_1Uint16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_1Uint16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb1:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x14f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb2:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x150,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x151,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x152,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb5:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x153,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb6:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x154,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb7:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x155,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb8:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint16x8_1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint16x8_1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x156,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint16x8_1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xb9:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x159,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xba:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Uint8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Uint8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Uint8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xbb:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xbc:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Uint8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Uint8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Uint8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xbd:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_2Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_2Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_2Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xbe:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_3Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_3Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_3Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xbf:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x15f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x160,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc1:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x161,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc2:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_1Uint8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_1Uint8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x162,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_1Uint8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x163,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_2Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_2Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x164,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_2Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc5:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Float32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Float32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x165,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Float32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc6:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Int32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Int32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x166,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Int32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 199:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Int16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Int16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x167,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Int16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 200:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Int8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Int8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x168,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Int8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xc9:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Uint32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Uint32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x169,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Uint32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xca:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Uint8x16_1Uint16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Uint8x16_1Uint16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x16a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Uint8x16_1Uint16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xcb:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x16d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xcc:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_1Int4_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_1Int4_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x16e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_1Int4_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xcd:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool32x4_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool32x4_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x16f,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool32x4_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xce:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x170,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xcf:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x171,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x172,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd1:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool32x4_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool32x4_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x173,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool32x4_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd2:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Bool32x4_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Bool32x4_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x174,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Bool32x4_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x177,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_1Int8_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_1Int8_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x178,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_1Int8_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd5:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool16x8_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool16x8_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x179,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool16x8_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd6:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x17a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd7:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x17b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd8:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x17c,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xd9:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool16x8_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool16x8_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x17d,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool16x8_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xda:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Bool16x8_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Bool16x8_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x17e,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Bool16x8_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xdb:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x181,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xdc:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_1Int16_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_1Int16_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x182,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_1Int16_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xdd:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x183,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xde:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Int1Bool8x16_1Int1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Int1Bool8x16_1Int1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x184,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Int1Bool8x16_1Int1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xdf:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_2Int2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_2Int2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x185,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_2Int2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe0:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_2_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_2_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x186,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_2_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe1:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Bool8x16_3_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Bool8x16_3_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x187,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Bool8x16_3_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe2:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::Reg1Bool8x16_1_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::Reg1Bool8x16_1_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x188,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::Reg1Bool8x16_1_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe3:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmSimdTypedArr_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmSimdTypedArr_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x18a,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::AsmSimdTypedArr_Small((ByteCodeReader *)&size);
        }
        break;
      case 0xe4:
        if (reader.m_endLocation._4_4_ == 2) {
          ByteCodeReader::AsmShuffle_Large((ByteCodeReader *)&size);
        }
        else if (reader.m_endLocation._4_4_ == 1) {
          ByteCodeReader::AsmShuffle_Medium((ByteCodeReader *)&size);
        }
        else {
          if (reader.m_endLocation._4_4_ != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                        ,0x18b,"((0))","(0)");
            goto joined_r0x0087cd71;
          }
          ByteCodeReader::AsmShuffle_Small((ByteCodeReader *)&size);
        }
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x3c0,"(false)","Unknown OpLayout");
        if (bVar6) {
          *puVar11 = 0;
          local_58[7] = 1;
          goto LAB_0087d946;
        }
        goto LAB_0087da37;
      }
      RewriteAsmJsByteCodesInto::anon_class_56_7_a35c0bdf::operator()
                ((anon_class_56_7_a35c0bdf *)local_e0);
LAB_0087d946:
    } while (local_58[7] == 0);
  }
  uVar4 = local_58._0_4_;
  HVar12 = -0x7ffdfdff;
  if ((local_58[7] & 1) == 0) {
    uVar8 = ByteBlock::GetLength(local_60);
    uVar5 = local_58._0_4_;
    if ((uVar4 == uVar8) || ((local_70->dwFlags & 2) != 0)) {
      *(undefined4 *)&pBVar9->field_0x14 = local_58._0_4_;
      HVar12 = 0;
      RewriteAuxiliaryInto
                (local_70,local_78,
                 (SListCounted<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator> *)
                 &saveBlock.cantGenerate,(ByteCodeReader *)&size,local_68,
                 (SerializedFieldList *)opStart);
    }
    else {
      uVar8 = ByteBlock::GetLength(local_60);
      if (uVar5 != uVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x3cd,"(size == byteBlock->GetLength())",
                                    "size == byteBlock->GetLength()");
        if (!bVar6) {
LAB_0087da37:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar11 = 0;
      }
    }
  }
  SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount> *)
             &saveBlock.cantGenerate);
  return HVar12;
}

Assistant:

HRESULT RewriteAsmJsByteCodesInto(BufferBuilderList & builder, LPCWSTR clue, FunctionBody * function, ByteBlock * byteBlock, SerializedFieldList& definedFields)
    {
        SListCounted<AuxRecord> auxRecords(alloc);

        auto finalSize = Anew(alloc, BufferBuilderInt32, _u("Final Byte Code Size"), 0); // Initially set to zero
        builder.list = builder.list->Prepend(finalSize, alloc);

        ByteCodeReader reader;
        reader.Create(function);

        uint32 size = 0;
        const byte * opStart = nullptr;
        bool cantGenerate = false;

        auto saveBlock = [&]() {
            uint32 byteCount;
            if (TryConvertToUInt32(reader.GetIP() - opStart, &byteCount))
            {
                if (!GenerateByteCodeForNative())
                {
                    auto block = Anew(alloc, BufferBuilderRaw, clue, byteCount, (const byte*)opStart);
                    builder.list = builder.list->Prepend(block, alloc);
                    size += byteCount;
                }
            }
            else
            {
                AssertMsg(false, "Unlikely: byte code size overflows 32 bits");
                cantGenerate = true;
            }
        };

        Assert(!function->HasCachedScopePropIds());

        while (!cantGenerate)
        {
            opStart = reader.GetIP();
            opStart; // For prefast. It can't figure out that opStart is captured in saveBlock above.
            LayoutSize layoutSize;
            OpCodeAsmJs op = reader.ReadAsmJsOp(layoutSize);
            if (op == OpCodeAsmJs::EndOfBlock)
            {
                saveBlock();
                break;
            }

            OpLayoutTypeAsmJs layoutType = OpCodeUtilAsmJs::GetOpCodeLayout(op);
            switch (layoutType)
            {

#define LAYOUT_TYPE(layout) \
    case OpLayoutTypeAsmJs::##layout: { \
        Assert(layoutSize == SmallLayout); \
        reader.##layout(); \
        saveBlock(); \
        break; }
#define LAYOUT_TYPE_WMS(layout) \
    case OpLayoutTypeAsmJs::##layout: { \
        switch (layoutSize) \
        { \
        case SmallLayout: \
            reader.##layout##_Small(); \
            break; \
        case MediumLayout: \
            reader.##layout##_Medium(); \
            break; \
        case LargeLayout: \
            reader.##layout##_Large(); \
            break; \
        default: \
            Assume(UNREACHED); \
        } \
       saveBlock(); \
       break;     }
#include "LayoutTypesAsmJs.h"
            default:
                AssertMsg(false, "Unknown OpLayout");
                cantGenerate = true;
                break;
            }
        }

        if (cantGenerate)
        {
            return ByteCodeSerializer::CantGenerate;
        }

        if (size != byteBlock->GetLength() && !GenerateByteCodeForNative())
        {
            Assert(size == byteBlock->GetLength());
            return ByteCodeSerializer::CantGenerate;
        }
        finalSize->value = size;

        RewriteAuxiliaryInto(builder, auxRecords, reader, function, definedFields);
        return S_OK;
    }